

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

void lscpp::protocol::to_json(json *j,ServerCapabilities *m)

{
  pair<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
  local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  
  local_28.m_type = null;
  local_28.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_28,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_28,true);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(j,&local_28);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::emplace<char_const(&)[14],bool_const&>
            (&local_50,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)j,(char (*) [14])"hoverProvider",&m->hoverProvider);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::emplace<char_const(&)[19],bool_const&>
            (&local_50,
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)j,(char (*) [19])"definitionProvider",&m->definitionProvider);
  if ((m->completionProvider).super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>
      ._M_payload.super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>.
      super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_engaged == true) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace<char_const(&)[19],lscpp::protocol::CompletionOptions_const&>
              (&local_50,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)j,(char (*) [19])"completionProvider",(CompletionOptions *)&m->completionProvider)
    ;
  }
  if ((m->textDocumentSync).
      super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
      super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_engaged == true) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace<char_const(&)[17],lscpp::protocol::TextDocumentSyncOptions_const&>
              (&local_50,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)j,(char (*) [17])"textDocumentSync",(TextDocumentSyncOptions *)m);
  }
  if ((m->diagnosticProvider).super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>
      ._M_payload.super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
      super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged == true) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::emplace<char_const(&)[19],lscpp::protocol::DiagnosticOptions_const&>
              (&local_50,
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)j,(char (*) [19])"diagnosticProvider",(DiagnosticOptions *)&m->diagnosticProvider)
    ;
  }
  return;
}

Assistant:

void to_json(nlohmann::json &j, const ServerCapabilities &m) {
  j = nlohmann::json{};
  j.emplace("hoverProvider", m.hoverProvider);
  j.emplace("definitionProvider", m.definitionProvider);
  if (m.completionProvider) {
    j.emplace("completionProvider", m.completionProvider.value());
  }
  if (m.textDocumentSync) {
    j.emplace("textDocumentSync", m.textDocumentSync.value());
  }
  if (m.diagnosticProvider) {
    j.emplace("diagnosticProvider", m.diagnosticProvider.value());
  }
}